

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_box2i(exr_context_t ctxt,int part_index,char *name,exr_attr_box2i_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_box2i_t *peVar1;
  exr_attr_v2i_t eVar2;
  int iVar3;
  exr_result_t eVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  exr_context_t nonc;
  char *pcVar6;
  exr_attribute_list_t *list;
  exr_result_t eStackY_50;
  exr_attribute_t *attr;
  
  if (name != (char *)0x0) {
    iVar3 = strcmp(name,"dataWindow");
    if (iVar3 == 0) {
      iVar3 = exr_set_data_window(ctxt,part_index,val);
      return iVar3;
    }
    iVar3 = strcmp(name,"displayWindow");
    if (iVar3 == 0) {
      iVar3 = exr_set_display_window(ctxt,part_index,val);
      return iVar3;
    }
  }
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar4 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar4;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 0x15;
LAB_00119283:
    eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_50);
    return eVar4;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 8;
    goto LAB_00119283;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar4 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar4 == 0) {
    if (attr->type != EXR_ATTR_BOX2I) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar6 = attr->type_name;
      pcVar5 = "\'%s\' requested type \'box2i\', but stored attributes is type \'%s\'";
      eVar4 = 0x10;
      goto LAB_00119367;
    }
    if (val == (exr_attr_box2i_t *)0x0) goto LAB_0011934f;
  }
  else {
    if (eVar4 != 0xf) goto LAB_00119326;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar4 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&attr);
    if (val == (exr_attr_box2i_t *)0x0) {
LAB_0011934f:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar5 = "No input value for setting \'%s\', type \'%s\'";
      pcVar6 = "box2i";
      eVar4 = 3;
LAB_00119367:
      eVar4 = (*ctxt->print_error)(ctxt,eVar4,pcVar5,name,pcVar6);
      return eVar4;
    }
    if (eVar4 != 0) goto LAB_00119326;
  }
  peVar1 = (attr->field_6).box2i;
  eVar2 = val->max;
  peVar1->min = val->min;
  peVar1->max = eVar2;
  eVar4 = 0;
LAB_00119326:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_set_box2i (
    exr_context_t           ctxt,
    int                     part_index,
    const char*             name,
    const exr_attr_box2i_t* val)
{
    if (name && 0 == strcmp (name, EXR_REQ_DATA_STR))
        return exr_set_data_window (ctxt, part_index, val);
    if (name && 0 == strcmp (name, EXR_REQ_DISP_STR))
        return exr_set_display_window (ctxt, part_index, val);

    {
        ATTR_SET_IMPL_DEREF (EXR_ATTR_BOX2I, box2i);
    }
}